

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O2

anon_enum_32
SCoro::Poll<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>
          (SCoro<PauseResume::Start,_PauseResume::Event> *obj)

{
  Result RVar1;
  ulong uVar2;
  
  RVar1 = (*Impl::
            GetImpl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::integer_sequence<unsigned_long,_0UL,_1UL>_>
            ::lut[(obj->super_EboIndex<2UL>).index])(obj);
  if (RVar1.value != Yield) {
    if (RVar1.value == Next) {
      uVar2 = (obj->super_EboIndex<2UL>).index + 1;
      (obj->super_EboIndex<2UL>).index = uVar2;
      RVar1.value = (uint)(uVar2 < 2) * 2;
    }
    else {
      RVar1.value = End;
    }
  }
  return RVar1.value;
}

Assistant:

constexpr auto Poll(Obj & obj) noexcept
    {
        switch (Impl::get(obj)(obj).value)
        {
        case Result::Next:
            return obj.Next() < obj.count ? Result::Next : Result::End;
        case Result::Yield:
            return Result::Yield;    
        default:
            return Result::End;
        }
    }